

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_idx_abc(jit_State *J,TRef asizeref,TRef ikey,uint32_t asize)

{
  IRRef1 IVar1;
  ushort uVar2;
  TRef TVar3;
  uint in_ECX;
  ushort in_DX;
  ushort in_SI;
  jit_State *in_RDI;
  uint32_t abc;
  int32_t stop;
  IRRef ofsref;
  int32_t ofs;
  IRIns *ir;
  IRRef ref;
  IRRef1 local_8c;
  jit_State *in_stack_ffffffffffffff78;
  jit_State *pjVar4;
  ushort local_70;
  int local_6c;
  IRIns *local_68;
  uint local_60;
  
  if ((in_RDI->flags & 0xc00000) == 0xc00000) {
    local_60 = (uint)in_DX;
    local_68 = (in_RDI->cur).ir + local_60;
    local_6c = 0;
    local_70 = 0;
    if (((local_68->field_1).o == ')') && ((local_68->field_0).op2 < 0x8000)) {
      local_70 = (local_68->field_0).op2;
      local_6c = (in_RDI->cur).ir[local_70].i;
      local_60 = (uint)(local_68->field_0).op1;
      local_68 = (in_RDI->cur).ir + local_60;
    }
    if ((local_60 == (in_RDI->scev).idx) &&
       ((ulong)((long)(int)in_RDI->L->base
                           [(long)(int)((local_68->field_0).op1 + 1) - (ulong)in_RDI->baseslot].n +
               (long)local_6c) < (ulong)in_ECX)) {
      uVar2 = 5;
      if (in_SI < 0x8000) {
        uVar2 = 0x14;
      }
      pjVar4 = in_RDI;
      if (local_6c == 0) {
        local_8c = (in_RDI->scev).stop;
      }
      else {
        IVar1 = (in_RDI->scev).stop;
        (in_RDI->fold).ins.field_0.ot = 0x2913;
        (in_RDI->fold).ins.field_0.op1 = IVar1;
        (in_RDI->fold).ins.field_0.op2 = local_70;
        TVar3 = lj_opt_fold(in_RDI);
        local_8c = (IRRef1)TVar3;
      }
      (pjVar4->fold).ins.field_0.ot = uVar2 | 0xa80;
      (pjVar4->fold).ins.field_0.op1 = in_SI;
      (pjVar4->fold).ins.field_0.op2 = local_8c;
      lj_opt_fold(pjVar4);
      if ((((in_RDI->scev).dir != '\0') && ((in_RDI->scev).start != 0)) &&
         (-1 < (long)(in_RDI->cur).ir[(in_RDI->scev).start].i + (long)local_6c)) {
        return;
      }
      (in_RDI->fold).ins.field_0.ot = uVar2 | 0xa80;
      (in_RDI->fold).ins.field_0.op1 = in_SI;
      (in_RDI->fold).ins.field_0.op2 = in_DX;
      lj_opt_fold(pjVar4);
      return;
    }
  }
  (in_RDI->fold).ins.field_0.ot = 0xa93;
  (in_RDI->fold).ins.field_0.op1 = in_SI;
  (in_RDI->fold).ins.field_0.op2 = in_DX;
  lj_opt_fold(in_stack_ffffffffffffff78);
  return;
}

Assistant:

static void rec_idx_abc(jit_State *J, TRef asizeref, TRef ikey, uint32_t asize)
{
  /* Try to emit invariant bounds checks. */
  if ((J->flags & (JIT_F_OPT_LOOP|JIT_F_OPT_ABC)) ==
      (JIT_F_OPT_LOOP|JIT_F_OPT_ABC)) {
    IRRef ref = tref_ref(ikey);
    IRIns *ir = IR(ref);
    int32_t ofs = 0;
    IRRef ofsref = 0;
    /* Handle constant offsets. */
    if (ir->o == IR_ADD && irref_isk(ir->op2)) {
      ofsref = ir->op2;
      ofs = IR(ofsref)->i;
      ref = ir->op1;
      ir = IR(ref);
    }
    /* Got scalar evolution analysis results for this reference? */
    if (ref == J->scev.idx) {
      int32_t stop;
      lj_assertJ(irt_isint(J->scev.t) && ir->o == IR_SLOAD,
		 "only int SCEV supported");
      stop = numberVint(&(J->L->base - J->baseslot)[ir->op1 + FORL_STOP]);
      /* Runtime value for stop of loop is within bounds? */
      if ((uint64_t)stop + ofs < (uint64_t)asize) {
	/* Emit invariant bounds check for stop. */
	uint32_t abc = IRTG(IR_ABC, tref_isk(asizeref) ? IRT_U32 : IRT_P32);
	emitir(abc, asizeref, ofs == 0 ? J->scev.stop :
	       emitir(IRTI(IR_ADD), J->scev.stop, ofsref));
	/* Emit invariant bounds check for start, if not const or negative. */
	if (!(J->scev.dir && J->scev.start &&
	      (int64_t)IR(J->scev.start)->i + ofs >= 0))
	  emitir(abc, asizeref, ikey);
	return;
      }
    }
  }
  emitir(IRTGI(IR_ABC), asizeref, ikey);  /* Emit regular bounds check. */
}